

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O0

pair<unsigned_int,_bool> __thiscall
sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
          (BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *this,
          unsigned_long_long *key)

{
  bool bVar1;
  pair<unsigned_int,_bool> pVar2;
  unsigned_long_long *in_RSI;
  int *in_RDI;
  int j;
  int i;
  node *x;
  locType pos;
  uint ret;
  uint5 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffad;
  byte in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  less<unsigned_long_long> local_43;
  less<unsigned_long_long> local_42;
  less<unsigned_long_long> local_41;
  int local_40;
  int local_3c;
  long local_38;
  undefined8 local_30;
  undefined4 local_28;
  pair<unsigned_int,_int> local_24;
  undefined4 local_1c;
  unsigned_long_long *local_18;
  pair<unsigned_int,_bool> local_8;
  
  if (*in_RDI == 0) {
    local_28 = 0;
    local_24 = std::make_pair<unsigned_int&,int>
                         ((uint *)CONCAT17(in_stack_ffffffffffffffaf,
                                           CONCAT16(in_stack_ffffffffffffffae,
                                                    CONCAT15(in_stack_ffffffffffffffad,
                                                             in_stack_ffffffffffffffa8))),
                          (int *)0x10ef64);
    std::pair<unsigned_int,_bool>::pair<unsigned_int,_int,_true>(&local_8,&local_24);
  }
  else {
    local_30 = *(undefined8 *)(in_RDI + 2);
    local_18 = in_RSI;
    for (local_3c = 0; local_3c < *in_RDI; local_3c = local_3c + 1) {
      local_38 = (**(code **)(**(long **)(in_RDI + 4) + 0x10))(*(long **)(in_RDI + 4),&local_30);
      local_40 = 0;
      while( true ) {
        in_stack_ffffffffffffffaf = false;
        if (local_40 < *(int *)(local_38 + 0x640)) {
          in_stack_ffffffffffffffaf =
               std::less<unsigned_long_long>::operator()
                         (&local_41,(unsigned_long_long *)(local_38 + 0x328 + (long)local_40 * 8),
                          local_18);
        }
        if ((bool)in_stack_ffffffffffffffaf == false) break;
        local_40 = local_40 + 1;
      }
      if (local_3c < *in_RDI + -1) {
        in_stack_ffffffffffffffae = 0;
        if (local_40 < *(int *)(local_38 + 0x640)) {
          bVar1 = std::less<unsigned_long_long>::operator()
                            (&local_42,local_18,
                             (unsigned_long_long *)(local_38 + 0x328 + (long)local_40 * 8));
          in_stack_ffffffffffffffae = bVar1 ^ 0xff;
        }
        if ((in_stack_ffffffffffffffae & 1) == 0) {
          local_30 = *(undefined8 *)(local_38 + (long)local_40 * 8);
        }
        else {
          local_30 = *(undefined8 *)(local_38 + (long)(local_40 + 1) * 8);
        }
      }
    }
    bVar1 = true;
    if (local_40 != *(int *)(local_38 + 0x640)) {
      bVar1 = std::less<unsigned_long_long>::operator()
                        (&local_43,local_18,
                         (unsigned_long_long *)(local_38 + 0x328 + (long)local_40 * 8));
    }
    if (bVar1 == false) {
      local_1c = *(undefined4 *)(local_38 + (long)local_40 * 4);
      pVar2 = std::make_pair<unsigned_int&,bool>
                        ((uint *)CONCAT17(in_stack_ffffffffffffffaf,
                                          CONCAT16(in_stack_ffffffffffffffae,
                                                   (uint6)in_stack_ffffffffffffffa8)),
                         (bool *)0x10f156);
      local_8.first = pVar2.first;
      local_8.second = pVar2.second;
    }
    else {
      pVar2 = std::make_pair<unsigned_int&,bool>
                        ((uint *)CONCAT17(in_stack_ffffffffffffffaf,
                                          CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT15(bVar1,in_stack_ffffffffffffffa8))),
                         (bool *)0x10f121);
      local_8.first = pVar2.first;
      local_8.second = pVar2.second;
    }
  }
  pVar2.second = local_8.second;
  pVar2._5_3_ = local_8._5_3_;
  pVar2.first = local_8.first;
  return pVar2;
}

Assistant:

std::pair<T, bool> find(const Key &key) {
            T ret;
            if (!depth)return std::make_pair(ret, 0);
            locType pos = root;
            node *x;
            int i, j;
            for (i = 0; i < depth; ++i) {
                x = file->read(pos);
                for (j = 0; j < x->sz && Compare()(x->keyvalue[j], key); ++j);
                if (i < depth - 1) {
                    if (j < x->sz && !Compare()(key, x->keyvalue[j]))pos = x->pointer[j + 1];
                    else pos = x->pointer[j];
                }
            }
            if (j == x->sz || Compare()(key, x->keyvalue[j]))
                return std::make_pair(ret, false);
            ret = x->val[j];
            return std::make_pair(ret, true);
        }